

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O1

void anon_unknown.dwarf_b78f2::AssertInt16Fails(char *s)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  ostream *poVar4;
  uint16_t actual;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  uint16_t local_3a;
  AssertHelper local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  sVar2 = strlen(s);
  local_48.ptr_._0_4_ = 1;
  local_38.data_._0_4_ = wabt::ParseInt16(s,s + sVar2,&local_3a,SignedAndUnsigned);
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            (local_30,"Result::Error","ParseInt16(s, end, &actual, ParseIntType::SignedAndUnsigned)"
             ,(Enum *)&local_48,(Result *)&local_38);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    poVar4 = (ostream *)(local_48.ptr_ + 0x10);
    if (s == (char *)0x0) {
      s = "(null)";
      sVar2 = 6;
    }
    else {
      sVar2 = strlen(s);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,s,sVar2);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-literal.cc"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_48.ptr_._0_4_ = 1;
    local_38.data_._0_4_ = wabt::ParseInt16(s,s + sVar2,&local_3a,UnsignedOnly);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              (local_30,"Result::Error","ParseInt16(s, end, &actual, ParseIntType::UnsignedOnly)",
               (Enum *)&local_48,(Result *)&local_38);
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      poVar4 = (ostream *)(local_48.ptr_ + 0x10);
      if (s == (char *)0x0) {
        s = "(null)";
        sVar2 = 6;
      }
      else {
        sVar2 = strlen(s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,s,sVar2);
      if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_28.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-literal.cc"
                 ,0x74,pcVar3);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_48.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_48.ptr_ + 8))();
        }
        local_48.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void AssertInt16Fails(const char* s) {
  const char* const end = s + strlen(s);
  uint16_t actual;
  ASSERT_EQ(Result::Error,
            ParseInt16(s, end, &actual, ParseIntType::SignedAndUnsigned))
      << s;
  ASSERT_EQ(Result::Error,
            ParseInt16(s, end, &actual, ParseIntType::UnsignedOnly))
      << s;
}